

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
gulps::message::message
          (message *this,level lvl,char *major,char *minor,char *path,int64_t line,string *text,
          color clr)

{
  time_t tVar1;
  gulps *this_00;
  string *psVar2;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  
  tVar1 = time((time_t *)0x0);
  this->time = tVar1;
  this->lvl = lvl;
  std::__cxx11::string::string((string *)&this->cat_major,major,&local_31);
  std::__cxx11::string::string((string *)&this->cat_minor,minor,&local_32);
  std::__cxx11::string::string((string *)&this->src_path,path,&local_33);
  this->src_line = line;
  this_00 = inst();
  psVar2 = thread_tag_abi_cxx11_(this_00);
  std::__cxx11::string::string((string *)&this->thread_id,(string *)psVar2);
  std::__cxx11::string::string((string *)&this->text,(string *)text);
  this->clr = clr;
  return;
}

Assistant:

message(level lvl, const char* major, const char* minor, const char* path, int64_t line, std::string&& text, fmt::color clr = fmt::color::white) : 
			time(std::time(nullptr)), lvl(lvl), cat_major(major), cat_minor(minor), src_path(path), src_line(line),
			thread_id(gulps::inst().get_thread_tag()), text(std::move(text)), clr(clr)
		{
		}